

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall CSlidingBucket::~CSlidingBucket(CSlidingBucket *this)

{
  void *pvVar1;
  long *in_RDI;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < (int)in_RDI[2]; local_c = local_c + 1) {
    if (*(long *)(*in_RDI + (long)local_c * 8) != 0) {
      if ((int)in_RDI[7] == 0) {
        pvVar1 = *(void **)(*in_RDI + (long)local_c * 8);
        if (pvVar1 != (void *)0x0) {
          operator_delete__(pvVar1);
        }
      }
      else {
        free(*(void **)(*in_RDI + (long)local_c * 8));
      }
      *(undefined8 *)(*in_RDI + (long)local_c * 8) = 0;
    }
  }
  if (((int)in_RDI[7] != 0) && ((void *)in_RDI[6] != (void *)0x0)) {
    operator_delete__((void *)in_RDI[6]);
  }
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete__((void *)*in_RDI);
  }
  *in_RDI = 0;
  if ((void *)in_RDI[1] != (void *)0x0) {
    operator_delete__((void *)in_RDI[1]);
  }
  return;
}

Assistant:

~CSlidingBucket()
    {
        for (int i = 0; i < numofbuckets; i++) {
            if (bucketV[i] != NULL) {
                if(initialdynamicsize)
                  free(bucketV[i]);
                else
                  delete[] bucketV[i];
                bucketV[i] = NULL;
            }
        }
        if(initialdynamicsize)
          delete [] dynamicsize;

        delete[] bucketV;
        bucketV = NULL;
        delete[] lastelementindexV;
    }